

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

unsigned_long ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(SpanReader *is)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  do {
    bVar2 = ser_readdata8<SpanReader>(is);
    if (uVar3 >> 0x39 != 0) {
      pcVar4 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar4,(error_code *)"ReadVarInt(): size too large");
LAB_002af7f8:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_002af84b:
      __stack_chk_fail();
    }
    uVar3 = (ulong)(bVar2 & 0x7f) | uVar3 << 7;
    if (-1 < (char)bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return uVar3;
      }
      goto LAB_002af84b;
    }
    if (uVar3 == 0xffffffffffffffff) {
      pcVar4 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar4,(error_code *)"ReadVarInt(): size too large");
      goto LAB_002af7f8;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}